

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_encoding.cpp
# Opt level: O0

void ximu::PacketEncoding::rightShiftBytes(vector<unsigned_char,_std::allocator<unsigned_char>_> *v)

{
  size_type sVar1;
  byte *pbVar2;
  undefined4 local_1c;
  int idx;
  size_t size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *v_local;
  
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(v);
  pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](v,sVar1 - 1);
  *pbVar2 = (byte)((int)(uint)*pbVar2 >> 1);
  for (local_1c = (int)sVar1 + -2; -1 < local_1c; local_1c = local_1c + -1) {
    pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (v,(long)local_1c);
    if ((*pbVar2 & 1) == 1) {
      pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (v,(long)(local_1c + 1));
      *pbVar2 = *pbVar2 | 0x80;
    }
    pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (v,(long)local_1c);
    *pbVar2 = (byte)((int)(uint)*pbVar2 >> 1);
  }
  return;
}

Assistant:

void PacketEncoding::rightShiftBytes(std::vector<unsigned char>& v) {
  size_t size = v.size();
  v[size - 1] >>= 1;

  for (int idx = size - 2; idx >= 0; --idx) {
    if ((v[idx] & 0x01) == 0x01)
      v[idx + 1] |= 0x80;
    v[idx] >>= 1;
  }
}